

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

PipelineRegressor * __thiscall
CoreML::Specification::PipelineRegressor::New(PipelineRegressor *this,Arena *arena)

{
  PipelineRegressor *this_00;
  
  this_00 = (PipelineRegressor *)operator_new(0x20);
  PipelineRegressor(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::PipelineRegressor>(arena,this_00);
  }
  return this_00;
}

Assistant:

PipelineRegressor* PipelineRegressor::New(::google::protobuf::Arena* arena) const {
  PipelineRegressor* n = new PipelineRegressor;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}